

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

node * make_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *phnids,int32 nphones,
                int32 ndensity,int32 nfeat,int32 dim,int32 npermute,int32 depth,int32 continuous)

{
  float32 **means_00;
  float32 **vars_00;
  float32 ***mixw_00;
  size_t n_elem;
  int32 npermute_00;
  cmd_ln_t *cmdln;
  ulong uVar1;
  node *sroot;
  int32 **lists;
  int32 *llist;
  node *pnVar2;
  uint uVar3;
  float32 fVar4;
  int32 nrclass;
  int32 nlclass;
  float32 **local_70;
  float32 **local_68;
  float32 ***local_60;
  node_str **local_58;
  int32 *local_50;
  size_t local_48;
  int32 *rclass;
  int32 *lclass;
  
  cmdln = cmd_ln_get();
  uVar1 = cmd_ln_int_r(cmdln,"-niter");
  local_70 = means;
  local_68 = vars;
  local_60 = mixw;
  sroot = make_simple_tree(means,vars,mixw,phnids,nphones,ndensity,nfeat,dim,npermute,depth,
                           continuous);
  if (0 < (int)uVar1) {
    local_48 = (size_t)npermute;
    local_58 = &sroot->left;
    do {
      n_elem = local_48;
      lists = (int32 **)
              __ckd_calloc_2d__(local_48,(long)nphones,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x293);
      llist = (int32 *)__ckd_calloc__(n_elem,4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                      ,0x294);
      npermute_00 = pare_tree(sroot,npermute,lists,llist);
      vars_00 = local_68;
      if (npermute_00 < 2) {
        *local_58 = (node_str *)0x0;
        local_58[1] = (node_str *)0x0;
      }
      else {
        fVar4 = permute(local_70,local_68,local_60,ndensity,nfeat,dim,lists,llist,npermute_00,
                        &lclass,&rclass,&nlclass,&nrclass,continuous);
        free_tree(sroot->left);
        free_tree(sroot->right);
        mixw_00 = local_60;
        means_00 = local_70;
        sroot->lkhd_dec = fVar4;
        local_50 = llist;
        pnVar2 = make_tree(local_70,vars_00,local_60,lclass,nlclass,ndensity,nfeat,dim,npermute,
                           depth + 1,continuous);
        llist = local_50;
        sroot->left = pnVar2;
        pnVar2 = make_tree(means_00,local_68,mixw_00,rclass,nrclass,ndensity,nfeat,dim,npermute,
                           depth + 1,continuous);
        sroot->right = pnVar2;
      }
      ckd_free_2d(lists);
      ckd_free(llist);
      uVar3 = (int)uVar1 - 1;
      uVar1 = (ulong)uVar3;
    } while (uVar3 != 0);
  }
  return sroot;
}

Assistant:

node  *make_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *phnids, int32 nphones, int32 ndensity, int32 nfeat,
           int32 dim, int32 npermute, int32 depth, int32 continuous)
{
    float32 lkhddec;
    int32 niter,iter,jpermute, **lists, *llists;
    int32 *lclass, nlclass, *rclass, nrclass;
    node *sroot;

    niter = cmd_ln_int32("-niter");

    sroot = make_simple_tree(means,vars,mixw,phnids,nphones,ndensity,nfeat,dim,npermute,depth, continuous);
    for (iter = 0; iter < niter; iter++) {
        /* overallocate lists of lists */
        lists = (int32 **) ckd_calloc_2d(npermute,nphones,sizeof(int32));
        llists = (int32 *) ckd_calloc(npermute,sizeof(int32));

        jpermute = pare_tree(sroot,npermute,lists,llists);
        if (jpermute > 1){
            lkhddec = permute(means,vars,mixw,ndensity,nfeat,dim,lists,llists,
                                   jpermute,&lclass,&rclass,&nlclass,&nrclass, continuous);
            free_tree(sroot->left); free_tree(sroot->right);
            sroot->lkhd_dec = lkhddec;
            sroot->left = 
                make_tree(means,vars,mixw,lclass,nlclass,ndensity,nfeat,
                          dim,npermute,depth+1, continuous);
            sroot->right = 
                make_tree(means,vars,mixw,rclass,nrclass,ndensity,nfeat,
                          dim,npermute,depth+1, continuous);
        }
        else { sroot->left = sroot->right = NULL; }
        ckd_free_2d((void **)lists); ckd_free(llists);
    }
    return(sroot);
}